

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

bool __thiscall CTxMemPool::HasNoInputsOf(CTxMemPool *this,CTransaction *tx)

{
  uchar *puVar1;
  long lVar2;
  bool bVar3;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  GenTxid local_59;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish == pCVar4) {
    bVar3 = true;
  }
  else {
    uVar6 = 0;
    uVar5 = 1;
    do {
      local_59.m_is_wtxid = false;
      local_59.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)pCVar4[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
      ;
      local_59.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            (pCVar4[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      puVar1 = pCVar4[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
      local_59.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_59.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
      bVar3 = exists(this,&local_59);
      if (bVar3) break;
      pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar7 = uVar5 <= uVar6;
      lVar2 = uVar6 - uVar5;
      uVar6 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar7 && lVar2 != 0);
    bVar3 = !bVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CTxMemPool::HasNoInputsOf(const CTransaction &tx) const
{
    for (unsigned int i = 0; i < tx.vin.size(); i++)
        if (exists(GenTxid::Txid(tx.vin[i].prevout.hash)))
            return false;
    return true;
}